

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O0

void __thiscall
TPZMHMeshControl::SetSubdomain(TPZMHMeshControl *this,TPZCompEl *cel,int64_t subdomain)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  TPZGeoEl *this_00;
  int64_t iVar3;
  int64_t iVar4;
  long *plVar5;
  int64_t in_RDX;
  TPZManVector<long,_10> *in_RSI;
  TPZCompEl *in_RDI;
  int64_t index;
  TPZGeoEl *gel;
  int64_t cindex;
  int ic;
  int ncon;
  TPZCompEl *in_stack_00000190;
  int64_t in_stack_ffffffffffffffc8;
  int64_t index_00;
  int64_t in_stack_ffffffffffffffd0;
  uint uVar6;
  TPZCompMesh *cmesh;
  
  iVar1 = (*(in_RSI->super_TPZVec<long>)._vptr_TPZVec[0x12])();
  for (uVar6 = 0; (int)uVar6 < iVar1; uVar6 = uVar6 + 1) {
    iVar2 = (*(in_RSI->super_TPZVec<long>)._vptr_TPZVec[0x14])(in_RSI,(ulong)uVar6);
    cmesh = (TPZCompMesh *)CONCAT44(extraout_var,iVar2);
    TPZCompEl::Mesh(in_stack_00000190);
    SetSubdomain((TPZMHMeshControl *)CONCAT44(iVar1,uVar6),cmesh,in_stack_ffffffffffffffd0,
                 in_stack_ffffffffffffffc8);
  }
  this_00 = TPZCompEl::Reference(in_RDI);
  iVar3 = TPZGeoEl::Index(this_00);
  index_00 = iVar3;
  iVar4 = TPZVec<long>::size((TPZVec<long> *)(in_RDI + 5));
  if (iVar4 <= iVar3) {
    TPZManVector<long,_10>::Resize(in_RSI,in_RDX,(long *)CONCAT44(iVar1,uVar6));
    plVar5 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 5),index_00);
    *plVar5 = in_RDX;
  }
  return;
}

Assistant:

void TPZMHMeshControl::SetSubdomain(TPZCompEl *cel, int64_t subdomain)
{
    int ncon = cel->NConnects();
    for (int ic=0; ic<ncon; ic++) {
        int64_t cindex = cel->ConnectIndex(ic);
        SetSubdomain(cel->Mesh(), cindex, subdomain);
    }
    TPZGeoEl *gel = cel->Reference();
    int64_t index = gel->Index();

    if (index >= fGeoToMHMDomain.size()) {
        fGeoToMHMDomain.Resize(index+1, -1);
        fGeoToMHMDomain[index] = subdomain;
    }
}